

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int fd;
  int iVar1;
  uint uVar2;
  int *piVar3;
  __sighandler_t p_Var4;
  ulong uVar5;
  uv_process_options_t *puVar6;
  uv_process_options_t *puVar7;
  sigset_t *__set;
  char **__argv;
  char *pcVar8;
  int iVar9;
  uv_process_options_t *puVar10;
  ulong uVar11;
  sigset_t set;
  
  puVar6 = (uv_process_options_t *)(ulong)(uint)stdio_count;
  pcVar8 = (char *)(ulong)(uint)error_fd;
  if ((options->flags & 8) != 0) {
    setsid();
  }
  uVar11 = 0;
  if (0 < stdio_count) {
    uVar11 = (ulong)(uint)stdio_count;
  }
  for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
    if ((uint)pipes[uVar5][1] < uVar5) {
      puVar6 = (uv_process_options_t *)0x0;
      iVar1 = fcntl64((ulong)(uint)pipes[uVar5][1],0,stdio_count);
      iVar9 = (int)puVar6;
      pipes[uVar5][1] = iVar1;
      if (iVar1 == -1) goto LAB_00113ce3;
    }
  }
  pcVar8 = "/dev/null";
  for (puVar7 = (uv_process_options_t *)0x0; iVar9 = (int)puVar7, iVar9 < stdio_count;
      puVar7 = (uv_process_options_t *)(ulong)((int)puVar7 + 1)) {
    iVar1 = pipes[iVar9][1];
    if (iVar1 < 0) {
      if (iVar9 < 3) {
        iVar1 = open64("/dev/null",(uint)(iVar9 != 0) * 2);
        fd = iVar1;
        if (-1 < iVar1) goto LAB_00113ba8;
LAB_00113caf:
        uv__write_errno(error_fd);
        options = puVar7;
        goto LAB_00113cb8;
      }
    }
    else {
      fd = pipes[iVar9][0];
LAB_00113ba8:
      if (iVar9 == iVar1) {
        puVar6 = (uv_process_options_t *)0x0;
        uv__cloexec_fcntl(iVar9,0);
        puVar10 = puVar7;
      }
      else {
        uVar2 = dup2(iVar1,iVar9);
        puVar10 = (uv_process_options_t *)(ulong)uVar2;
        puVar6 = puVar7;
        puVar7 = puVar10;
        if (uVar2 == 0xffffffff) goto LAB_00113caf;
      }
      if ((int)puVar10 < 3) {
        puVar6 = (uv_process_options_t *)0x0;
        uv__nonblock_fcntl((int)puVar10,0);
      }
      puVar7 = puVar10;
      if (stdio_count <= fd) {
        uv__close(fd);
      }
    }
  }
  pcVar8 = (char *)(ulong)(uint)error_fd;
  for (uVar5 = 0; iVar9 = (int)puVar6, uVar11 != uVar5; uVar5 = uVar5 + 1) {
    if (stdio_count <= pipes[uVar5][1]) {
      uv__close(pipes[uVar5][1]);
    }
  }
  if (options->cwd != (char *)0x0) {
    iVar1 = chdir(options->cwd);
    if (iVar1 != 0) goto LAB_00113ce3;
  }
  uVar2 = options->flags;
  if ((uVar2 & 3) != 0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    iVar9 = 0;
    setgroups(0,(__gid_t *)0x0);
    *piVar3 = iVar1;
    uVar2 = options->flags;
  }
  if ((uVar2 & 2) != 0) {
    iVar1 = setgid(options->gid);
    if (iVar1 != 0) goto LAB_00113ce3;
    uVar2 = options->flags;
  }
  if ((uVar2 & 1) != 0) {
    iVar1 = setuid(options->uid);
    if (iVar1 != 0) goto LAB_00113ce3;
  }
  if (options->env != (char **)0x0) {
    _environ = options->env;
  }
  iVar1 = 1;
  do {
    if ((iVar1 != 9) && (iVar1 != 0x13)) {
      if (iVar1 == 0x20) break;
      iVar9 = 0;
      p_Var4 = signal(iVar1,(__sighandler_t)0x0);
      if (p_Var4 == (__sighandler_t)0xffffffffffffffff) goto LAB_00113ce3;
    }
    iVar1 = iVar1 + 1;
  } while( true );
LAB_00113cb8:
  __set = (sigset_t *)&set;
  sigemptyset(__set);
  iVar1 = pthread_sigmask(2,__set,(__sigset_t *)0x0);
  iVar9 = (int)__set;
  if (iVar1 == 0) {
    __argv = options->args;
    execvp(options->file,__argv);
    iVar9 = (int)__argv;
  }
LAB_00113ce3:
  uv__write_errno((int)pcVar8);
  uv_kill(*(int *)(pcVar8 + 0x68),iVar9);
  return;
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t set;
  int close_fd;
  int use_fd;
  int err;
  int fd;
  int n;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

  if (options->env != NULL) {
    environ = options->env;
  }

  /* Reset signal disposition.  Use a hard-coded limit because NSIG
   * is not fixed on Linux: it's either 32, 34 or 64, depending on
   * whether RT signals are enabled.  We are not allowed to touch
   * RT signal handlers, glibc uses them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  /* Reset signal mask. */
  sigemptyset(&set);
  err = pthread_sigmask(SIG_SETMASK, &set, NULL);

  if (err != 0)
    uv__write_errno(error_fd);

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif

  uv__write_errno(error_fd);
}